

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrAlgo.h
# Opt level: O1

bool __thiscall InplaceStr::operator==(InplaceStr *this,InplaceStr *rhs)

{
  char *__s1;
  char *__s2;
  int iVar1;
  uint uVar2;
  
  __s1 = this->begin;
  __s2 = rhs->begin;
  if ((__s1 == __s2) && (this->end == rhs->end)) {
    return true;
  }
  uVar2 = (int)this->end - (int)__s1;
  if (uVar2 == *(int *)&rhs->end - (int)__s2) {
    iVar1 = bcmp(__s1,__s2,(ulong)uVar2);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool operator==(const InplaceStr& rhs) const
	{
		if(begin == rhs.begin && end == rhs.end)
			return true;

		return unsigned(end - begin) == unsigned(rhs.end - rhs.begin) && memcmp(begin, rhs.begin, unsigned(end - begin)) == 0;
	}